

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall Alice::PermuteData(Alice *this)

{
  int iVar1;
  iterator __position;
  long lVar2;
  Server *this_00;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  long *__args;
  long lVar6;
  bool bVar7;
  long lVar8;
  undefined1 local_d0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Pi_R_D;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  S;
  long local_90;
  vector<DataElement,_std::allocator<DataElement>_> local_78;
  undefined1 local_60 [8];
  vector<DataElement,_std::allocator<DataElement>_> Temp;
  vector<DataElement,_std::allocator<DataElement>_> V;
  
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_d0,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Pi_R_D.
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)&Pi_R_D.
               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
           (allocator_type *)
           &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)(this->super_Party).n_d,
             (allocator_type *)local_60);
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_60,
             (long)(this->super_Party).n_d,(allocator_type *)&local_78);
  Server::ReceiveDataVector(&local_78,this->srv);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_78);
  if (local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<DataElement,_std::allocator<DataElement>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<DataElement,std::allocator<DataElement>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<DataElement*,std::vector<DataElement,std::allocator<DataElement>>>>
            ((vector<DataElement,std::allocator<DataElement>> *)local_60,
             Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&Pi_R_D.
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Permutation Pi_A: ",0x12);
  if (0 < (this->super_Party).n_d) {
    lVar8 = 0;
    do {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar5 = 0;
      bVar3 = true;
      do {
        bVar7 = bVar3;
        iVar1 = (this->super_Party).Pi_D.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        *(long *)(*(long *)&(this->super_Party).D.
                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar1].
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data + lVar5 * 8) =
             Pi_R_D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar8].
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar5];
        Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[iVar1].val[lVar5] =
             ((pointer)((long)local_60 + lVar8 * 0x10))->val[lVar5];
        __args = (long *)(lVar5 * 8 +
                         *(long *)&(this->super_Party).R_D.
                                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data);
        __position._M_current =
             (((pointer)((long)local_d0 + (long)iVar1 * 0x18))->
             super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (((pointer)((long)local_d0 + (long)iVar1 * 0x18))->
            super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)((long)local_d0 + (long)iVar1 * 0x18),
                     __position,__args);
        }
        else {
          *__position._M_current = *__args;
          *(long **)((vector<long,std::allocator<long>> *)((long)local_d0 + (long)iVar1 * 0x18) + 8)
               = __position._M_current + 1;
        }
        lVar5 = 1;
        bVar3 = false;
      } while (bVar7);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->super_Party).n_d);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nAlice\'s Permuted Data D_A:\n ",0x1d);
  if (0 < (this->super_Party).n_d) {
    lVar8 = 0;
    do {
      lVar5 = *(long *)&(this->super_Party).U_D.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8].
                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data;
      lVar6 = 0;
      bVar3 = true;
      do {
        bVar7 = bVar3;
        lVar2 = *(long *)&(this->super_Party).D.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data;
        *(long *)(lVar2 + lVar6 * 8) = *(long *)(lVar2 + lVar6 * 8) + *(long *)(lVar5 + lVar6 * 8);
        poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        lVar5 = *(long *)&(this->super_Party).U_D.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8].
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data;
        Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[lVar8].val[lVar6] =
             Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage[lVar8].val[lVar6] -
             ((((pointer)((long)local_d0 + lVar8 * 0x18))->
              super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
              _M_start[lVar6] + *(long *)(lVar5 + lVar6 * 8));
        lVar6 = 1;
        bVar3 = false;
      } while (bVar7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->super_Party).n_d);
  }
  this_00 = this->srv;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)
             &S.
              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<DataElement,_std::allocator<DataElement>_> *)
             &Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Server::SendDataVector
            (this_00,(vector<DataElement,_std::allocator<DataElement>_> *)
                     &S.
                      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(this->super_Party).n_p);
  if (S.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(S.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_90 -
                    (long)S.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_60 != (undefined1  [8])0x0) {
    operator_delete((void *)local_60,
                    (long)Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)local_60);
  }
  if (Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)V.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)Temp.super__Vector_base<DataElement,_std::allocator<DataElement>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&Pi_R_D.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_d0);
  return;
}

Assistant:

void Alice::PermuteData()
{
    std::vector<std::vector<long>> Pi_R_D(n_d), S(n_d);
    std::vector<DataElement> V(n_d), Temp(n_d);
    V = srv->ReceiveDataVector();    //receive Bob's masked share of D
    Temp.assign(V.begin(), V.end());
    S.assign(D.begin(), D.end());
    std::cout<<"Permutation Pi_A: ";
    for(int i=0; i < n_d; i++)
    {
        std::cout<<Pi_D[i]<<" ";
        for(int j=0;  j < 2; j++)
        {
            D[Pi_D[i]][j] = S[i][j]; //Applying Pi on Alice's Share of D
            V[Pi_D[i]].val[j] = Temp[i].val[j]; //Applying Pi on Bob's masked Share of D
            Pi_R_D[Pi_D[i]].push_back(R_D[i][j]);  //Prepping shuffle vector needed for resplit
        }
    }
    std::cout<<"\nAlice's Permuted Data D_A:\n ";
    for(int i=0; i < n_d; i++)
    {
        for(int j=0;  j < 2; j++)
        {
            D[i][j] += U_D[i][j];   //resplitting Alice's share of D
            std::cout<<D[i][j]<<" ";
            V[i].val[j] = V[i].val[j] - Pi_R_D[i][j] - U_D[i][j]; //resplitting Bob's share of D
        }
        std::cout<<std::endl;
    }
    srv->SendDataVector(V, n_p); //sending Bob his BlindPermuted share of D
}